

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O0

NonSemanticShaderDebugInfo100Instructions __thiscall
spvtools::opt::Instruction::GetShader100DebugOpcode(Instruction *this)

{
  Op OVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  IRContext *pIVar4;
  FeatureManager *pFVar5;
  uint32_t opcode;
  Instruction *this_local;
  
  OVar1 = Instruction::opcode(this);
  if (OVar1 == OpExtInst) {
    pIVar4 = context(this);
    pFVar5 = IRContext::get_feature_mgr(pIVar4);
    uVar2 = FeatureManager::GetExtInstImportId_Shader100DebugInfo(pFVar5);
    if (uVar2 == 0) {
      this_local._4_4_ = NonSemanticShaderDebugInfo100InstructionsMax;
    }
    else {
      uVar2 = GetSingleWordInOperand(this,0);
      pIVar4 = context(this);
      pFVar5 = IRContext::get_feature_mgr(pIVar4);
      uVar3 = FeatureManager::GetExtInstImportId_Shader100DebugInfo(pFVar5);
      if (uVar2 == uVar3) {
        this_local._4_4_ = GetSingleWordInOperand(this,1);
        if (0x7fffffe < this_local._4_4_) {
          this_local._4_4_ = NonSemanticShaderDebugInfo100InstructionsMax;
        }
      }
      else {
        this_local._4_4_ = NonSemanticShaderDebugInfo100InstructionsMax;
      }
    }
  }
  else {
    this_local._4_4_ = NonSemanticShaderDebugInfo100InstructionsMax;
  }
  return this_local._4_4_;
}

Assistant:

NonSemanticShaderDebugInfo100Instructions Instruction::GetShader100DebugOpcode()
    const {
  if (opcode() != spv::Op::OpExtInst) {
    return NonSemanticShaderDebugInfo100InstructionsMax;
  }

  if (!context()->get_feature_mgr()->GetExtInstImportId_Shader100DebugInfo()) {
    return NonSemanticShaderDebugInfo100InstructionsMax;
  }

  if (GetSingleWordInOperand(kExtInstSetIdInIdx) !=
      context()->get_feature_mgr()->GetExtInstImportId_Shader100DebugInfo()) {
    return NonSemanticShaderDebugInfo100InstructionsMax;
  }

  uint32_t opcode = GetSingleWordInOperand(kExtInstInstructionInIdx);
  if (opcode >= NonSemanticShaderDebugInfo100InstructionsMax) {
    return NonSemanticShaderDebugInfo100InstructionsMax;
  }

  return NonSemanticShaderDebugInfo100Instructions(opcode);
}